

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * libtorrent::filename(string *__return_storage_ptr__,string *f)

{
  size_type sVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *__s;
  
  sVar1 = f->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    __s = "";
  }
  else {
    __s = (f->_M_dataplus)._M_p;
    pcVar3 = strrchr(__s,0x2f);
    if (pcVar3 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__s + sVar1);
      return __return_storage_ptr__;
    }
    if ((long)pcVar3 - (long)__s == (long)((int)sVar1 + -1)) {
      if (pcVar3 < __s || (long)pcVar3 - (long)__s == 0) {
        uVar6 = 0;
      }
      else {
        lVar5 = 0;
        do {
          if (pcVar3[lVar5 + -1] == '/') {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __s = pcVar3 + lVar5;
            goto LAB_0023f3d8;
          }
          lVar2 = lVar5 + -1;
          lVar5 = lVar5 + -1;
        } while (__s < pcVar3 + lVar2);
        uVar6 = (long)pcVar3 - (long)__s & 0xffffffff;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = __s + uVar6;
    }
    else {
      __s = pcVar3 + 1;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar4 = strlen(__s);
      pcVar3 = pcVar3 + sVar4 + 1;
    }
  }
LAB_0023f3d8:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string filename(std::string const& f)
	{
		if (f.empty()) return "";
		char const* first = f.c_str();
		char const* sep = std::strrchr(first, '/');
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		char const* altsep = std::strrchr(first, '\\');
		if (sep == nullptr || altsep > sep) sep = altsep;
#endif
		if (sep == nullptr) return f;

		if (sep - first == int(f.size()) - 1)
		{
			// if the last character is a / (or \)
			// ignore it
			int len = 0;
			while (sep > first)
			{
				--sep;
				if (*sep == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
					|| *sep == '\\'
#endif
					)
					return std::string(sep + 1, std::size_t(len));
				++len;
			}
			return std::string(first, std::size_t(len));

		}
		return std::string(sep + 1);
	}